

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::pid_formatter<spdlog::details::null_scoped_padder>::format
          (pid_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *param_2,
          memory_buf_t *dest)

{
  uint32_t n;
  
  n = getpid();
  ::fmt::v6::internal::count_digits(n);
  fmt_helper::append_int<unsigned_int>(n,dest);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &, memory_buf_t &dest) override
    {
        const auto pid = static_cast<uint32_t>(details::os::pid());
        auto field_size = fmt_helper::count_digits(pid);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(pid, dest);
    }